

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

SQInteger __thiscall
SQArray::Next(SQArray *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQTable *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *pSVar3;
  SQCollectable *local_50;
  SQObjectValue local_48;
  SQObjectPtr *local_40;
  SQObjectPtr *o;
  SQUnsignedInteger idx;
  SQObjectPtr *outval_local;
  SQObjectPtr *outkey_local;
  SQObjectPtr *refpos_local;
  SQArray *this_local;
  
  idx = (SQUnsignedInteger)outval;
  outval_local = outkey;
  outkey_local = refpos;
  refpos_local = (SQObjectPtr *)this;
  pSVar2 = (SQObjectPtr *)TranslateIndex(refpos);
  o = pSVar2;
  pSVar3 = (SQObjectPtr *)sqvector<SQObjectPtr>::size(&this->_values);
  if (pSVar2 < pSVar3) {
    ::SQObjectPtr::operator=(outval_local,(SQInteger)o);
    local_40 = sqvector<SQObjectPtr>::operator[](&this->_values,(SQUnsignedInteger)o);
    if ((local_40->super_SQObject)._type == OT_WEAKREF) {
      pSVar1 = (local_40->super_SQObject)._unVal.pTable;
      local_50 = (pSVar1->super_SQDelegable).super_SQCollectable._next;
      local_48 = (SQObjectValue)(pSVar1->super_SQDelegable).super_SQCollectable._prev;
    }
    else {
      local_50 = *(SQCollectable **)&local_40->super_SQObject;
      local_48 = (local_40->super_SQObject)._unVal;
    }
    ::SQObjectPtr::operator=((SQObjectPtr *)idx,(SQObject *)&local_50);
    this_local = (SQArray *)((long)&(o->super_SQObject)._type + 1);
  }
  else {
    this_local = (SQArray *)0xffffffffffffffff;
  }
  return (SQInteger)this_local;
}

Assistant:

SQInteger Next(const SQObjectPtr &refpos,SQObjectPtr &outkey,SQObjectPtr &outval)
    {
        SQUnsignedInteger idx=TranslateIndex(refpos);
        while(idx<_values.size()){
            //first found
            outkey=(SQInteger)idx;
            SQObjectPtr &o = _values[idx];
            outval = _realval(o);
            //return idx for the next iteration
            return ++idx;
        }
        //nothing to iterate anymore
        return -1;
    }